

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QByteArray,_QRhiGles2::PipelineCacheData>::emplace_helper<QRhiGles2::PipelineCacheData>
          (QHash<QByteArray,_QRhiGles2::PipelineCacheData> *this,QByteArray *key,
          PipelineCacheData *args)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  piter pVar4;
  Node<QByteArray,_QRhiGles2::PipelineCacheData> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_>::
  findOrInsert<QByteArray>((InsertionResult *)local_38,this->d,key);
  this_00 = (Node<QByteArray,_QRhiGles2::PipelineCacheData> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    pDVar1 = (key->d).d;
    (key->d).d = (Data *)0x0;
    (this_00->key).d.d = pDVar1;
    pcVar2 = (key->d).ptr;
    (key->d).ptr = (char *)0x0;
    (this_00->key).d.ptr = pcVar2;
    qVar3 = (key->d).size;
    (key->d).size = 0;
    (this_00->key).d.size = qVar3;
    (this_00->value).format = args->format;
    pDVar1 = (args->data).d.d;
    (args->data).d.d = (Data *)0x0;
    (this_00->value).data.d.d = pDVar1;
    pcVar2 = (args->data).d.ptr;
    (args->data).d.ptr = (char *)0x0;
    (this_00->value).data.d.ptr = pcVar2;
    qVar3 = (args->data).d.size;
    (args->data).d.size = 0;
    (this_00->value).data.d.size = qVar3;
  }
  else {
    QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>::
    emplaceValue<QRhiGles2::PipelineCacheData>(this_00,args);
  }
  pVar4.bucket = local_38._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }